

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

void __thiscall CoreML::ShapeConstraint::updateConstraint(ShapeConstraint *this,FeatureType *type)

{
  ulong uVar1;
  Rep *pRVar2;
  ShapeConstraint *this_00;
  uint32 uVar3;
  ArrayFeatureType *pAVar4;
  ArrayFeatureType_EnumeratedShapes *pAVar5;
  Type *range;
  Type *pTVar6;
  ImageFeatureType *pIVar7;
  ImageFeatureType_EnumeratedImageSizes *pIVar8;
  Type *pTVar9;
  ulong *puVar10;
  long lVar11;
  LogMessage *pLVar12;
  ImageFeatureType_ImageSizeRange *pIVar13;
  runtime_error *prVar14;
  long *plVar15;
  void **ppvVar16;
  long *plVar17;
  long lVar18;
  int i_1;
  ulong uVar19;
  size_t sVar20;
  int i;
  int iVar21;
  SizeRange *pSVar22;
  ulong uVar23;
  int i_2;
  int index;
  ulong max;
  int iVar24;
  ulong min;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  ShapeRange widthRange;
  ShapeRange heightRange;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> local_a8;
  ShapeConstraint *local_90;
  undefined1 local_88 [24];
  _Alloc_hider _Stack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (type->_oneof_case_[0] == 5) {
    local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start = (ShapeRange *)0x0;
    local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_finish = (ShapeRange *)0x0;
    local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (ShapeRange *)0x0;
    uVar3 = ((type->Type_).multiarraytype_)->_oneof_case_[0];
    if (uVar3 == 0x15) {
      pAVar5 = (((type->Type_).multiarraytype_)->ShapeFlexibility_).enumeratedshapes_;
      lVar11 = (long)(pAVar5->shapes_).super_RepeatedPtrFieldBase.current_size_;
      pRVar2 = (pAVar5->shapes_).super_RepeatedPtrFieldBase.rep_;
      ppvVar16 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar16 = (void **)0x0;
      }
      local_90 = this;
      if (lVar11 != 0) {
        lVar18 = 0;
        iVar21 = 0;
        do {
          iVar24 = *(int *)(*(long *)((long)ppvVar16 + lVar18) + 0x10);
          if (iVar21 < iVar24) {
            iVar21 = iVar24;
          }
          lVar18 = lVar18 + 8;
        } while (lVar11 * 8 != lVar18);
        if (0 < iVar21) {
          iVar24 = 0;
          do {
            uVar19 = 0xffffffffffffffff;
            sVar20 = 0;
            index = 0;
            while( true ) {
              if (type->_oneof_case_[0] == 5) {
                pAVar4 = (type->Type_).multiarraytype_;
              }
              else {
                pAVar4 = Specification::ArrayFeatureType::default_instance();
              }
              if (pAVar4->_oneof_case_[0] == 0x15) {
                pAVar5 = (pAVar4->ShapeFlexibility_).enumeratedshapes_;
              }
              else {
                pAVar5 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
              }
              if ((pAVar5->shapes_).super_RepeatedPtrFieldBase.current_size_ <= index) break;
              if (type->_oneof_case_[0] == 5) {
                pAVar4 = (type->Type_).multiarraytype_;
              }
              else {
                pAVar4 = Specification::ArrayFeatureType::default_instance();
              }
              if (pAVar4->_oneof_case_[0] == 0x15) {
                pAVar5 = (pAVar4->ShapeFlexibility_).enumeratedshapes_;
              }
              else {
                pAVar5 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
              }
              pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                                 (&(pAVar5->shapes_).super_RepeatedPtrFieldBase,index);
              puVar10 = (ulong *)google::protobuf::RepeatedField<long>::Get(&pTVar9->shape_,iVar24);
              uVar23 = *puVar10;
              if (uVar23 <= uVar19) {
                uVar19 = uVar23;
              }
              if (sVar20 <= uVar23) {
                sVar20 = uVar23;
              }
              index = index + 1;
            }
            ShapeRange::ShapeRange((ShapeRange *)local_88,uVar19,sVar20);
            if (local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::
              _M_realloc_insert<CoreML::ShapeRange>
                        (&local_a8,
                         (iterator)
                         local_a8.
                         super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(ShapeRange *)local_88);
            }
            else {
              *(undefined8 *)
               &(local_a8.
                 super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_maximum = local_88._16_8_;
              ((local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_maximum)._val = (size_t)_Stack_70._M_p
              ;
              *(undefined8 *)
               &(local_a8.
                 super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl
                 .super__Vector_impl_data._M_finish)->_minimum = local_88._0_8_;
              ((local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_minimum)._val = local_88._8_8_;
              local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_a8.
                   super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar24 = iVar24 + 1;
          } while (iVar24 != iVar21);
        }
      }
    }
    else {
      local_90 = this;
      if (uVar3 == 0x1f) {
        iVar21 = 0;
        uVar3 = 5;
        while( true ) {
          if (uVar3 == 5) {
            pAVar4 = (type->Type_).multiarraytype_;
          }
          else {
            pAVar4 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar4->_oneof_case_[0] == 0x1f) {
            pAVar5 = (pAVar4->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar5 = (ArrayFeatureType_EnumeratedShapes *)
                     Specification::ArrayFeatureType_ShapeRange::default_instance();
          }
          if ((pAVar5->shapes_).super_RepeatedPtrFieldBase.current_size_ <= iVar21) break;
          if (type->_oneof_case_[0] == 5) {
            pAVar4 = (type->Type_).multiarraytype_;
          }
          else {
            pAVar4 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar4->_oneof_case_[0] == 0x1f) {
            pAVar5 = (pAVar4->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar5 = (ArrayFeatureType_EnumeratedShapes *)
                     Specification::ArrayFeatureType_ShapeRange::default_instance();
          }
          range = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                            (&(pAVar5->shapes_).super_RepeatedPtrFieldBase,iVar21);
          ShapeRange::ShapeRange((ShapeRange *)local_88,range);
          if (local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::
            _M_realloc_insert<CoreML::ShapeRange>
                      (&local_a8,
                       (iterator)
                       local_a8.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(ShapeRange *)local_88);
          }
          else {
            *(undefined8 *)
             &(local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
               _M_impl.super__Vector_impl_data._M_finish)->_maximum = local_88._16_8_;
            ((local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_finish)->_maximum)._val = (size_t)_Stack_70._M_p;
            *(undefined8 *)
             &(local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
               _M_impl.super__Vector_impl_data._M_finish)->_minimum = local_88._0_8_;
            ((local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_finish)->_minimum)._val = local_88._8_8_;
            local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_a8.
                 super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          iVar21 = iVar21 + 1;
          uVar3 = type->_oneof_case_[0];
        }
      }
    }
    this_00 = local_90;
    lVar11 = (long)local_a8.
                   super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_a8.
                   super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar11 == 0) {
      if (type->_oneof_case_[0] == 5) {
        pAVar4 = (type->Type_).multiarraytype_;
      }
      else {
        pAVar4 = Specification::ArrayFeatureType::default_instance();
      }
      if ((pAVar4->shape_).current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar12 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar12);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      ShapeRange::setValue(&this_00->_channelRange,((pAVar4->shape_).rep_)->elements[0]);
      if (type->_oneof_case_[0] == 5) {
        pAVar4 = (ArrayFeatureType *)(type->Type_).int64type_;
      }
      else {
        pAVar4 = Specification::ArrayFeatureType::default_instance();
      }
      if ((pAVar4->shape_).current_size_ == 3) {
        if (type->_oneof_case_[0] == 5) {
          pAVar4 = (type->Type_).multiarraytype_;
        }
        else {
          pAVar4 = Specification::ArrayFeatureType::default_instance();
        }
        if ((pAVar4->shape_).current_size_ < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar12 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar12);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
        }
        ShapeRange::setValue(&this_00->_heightRange,(size_t)(pAVar4->shape_).rep_[1].arena);
        if (type->_oneof_case_[0] == 5) {
          pAVar4 = (type->Type_).multiarraytype_;
        }
        else {
          pAVar4 = Specification::ArrayFeatureType::default_instance();
        }
        if ((pAVar4->shape_).current_size_ < 3) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar12 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar12);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
        }
        sVar20 = (pAVar4->shape_).rep_[1].elements[0];
      }
      else {
        sVar20 = 1;
        ShapeRange::setValue(&this_00->_heightRange,1);
      }
      ShapeRange::setValue(&this_00->_widthRange,sVar20);
    }
    else if (lVar11 == 3) {
      updateChannelRange(local_90,local_a8.
                                  super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      updateHeightRange(this_00,local_a8.
                                super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
      updateWidthRange(this_00,local_a8.
                               super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2);
    }
    else {
      if (lVar11 != 1) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"Attempting to constrain an input or output feature \"",
                       &this_00->_name);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_88._0_8_ = *plVar15;
        plVar17 = plVar15 + 2;
        if ((long *)local_88._0_8_ == plVar17) {
          local_88._16_8_ = *plVar17;
          _Stack_70._M_p = (pointer)plVar15[3];
          local_88._0_8_ = local_88 + 0x10;
        }
        else {
          local_88._16_8_ = *plVar17;
        }
        local_88._8_8_ = plVar15[1];
        *plVar15 = (long)plVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::runtime_error::runtime_error(prVar14,(string *)local_88);
        __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      updateChannelRange(local_90,local_a8.
                                  super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl
        .super__Vector_impl_data._M_start != (ShapeRange *)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    if (type->_oneof_case_[0] != 4) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"Attempting to update feature constraint ",&this->_name);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_88._0_8_ = *plVar15;
      plVar17 = plVar15 + 2;
      if ((long *)local_88._0_8_ == plVar17) {
        local_88._16_8_ = *plVar17;
        _Stack_70._M_p = (pointer)plVar15[3];
        local_88._0_8_ = local_88 + 0x10;
      }
      else {
        local_88._16_8_ = *plVar17;
      }
      local_88._8_8_ = plVar15[1];
      *plVar15 = (long)plVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::runtime_error::runtime_error(prVar14,(string *)local_88);
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ShapeRange::setValue
              (&this->_channelRange,(ulong)(((type->Type_).imagetype_)->colorspace_ != 10) * 2 + 1);
    if (type->_oneof_case_[0] == 4) {
      pIVar7 = (type->Type_).imagetype_;
    }
    else {
      pIVar7 = Specification::ImageFeatureType::default_instance();
    }
    uVar3 = pIVar7->_oneof_case_[0];
    if (uVar3 == 0) {
      if (type->_oneof_case_[0] == 4) {
        pIVar7 = (type->Type_).imagetype_;
      }
      else {
        pIVar7 = Specification::ImageFeatureType::default_instance();
      }
      ShapeRange::setValue(&this->_heightRange,pIVar7->height_);
      if (type->_oneof_case_[0] == 4) {
        pIVar7 = (type->Type_).imagetype_;
      }
      else {
        pIVar7 = Specification::ImageFeatureType::default_instance();
      }
      ShapeRange::setValue(&this->_widthRange,pIVar7->width_);
      return;
    }
    if (uVar3 == 0x1f) {
      if (type->_oneof_case_[0] == 4) {
        pIVar7 = (type->Type_).imagetype_;
      }
      else {
        pIVar7 = Specification::ImageFeatureType::default_instance();
      }
      if (pIVar7->_oneof_case_[0] == 0x1f) {
        pIVar13 = (pIVar7->SizeFlexibility_).imagesizerange_;
      }
      else {
        pIVar13 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
      }
      pSVar22 = pIVar13->widthrange_;
      if (pSVar22 == (SizeRange *)0x0) {
        pSVar22 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      ShapeRange::ShapeRange((ShapeRange *)local_88,pSVar22);
      updateWidthRange(this,(ShapeRange *)local_88);
      if (type->_oneof_case_[0] == 4) {
        pIVar7 = (type->Type_).imagetype_;
      }
      else {
        pIVar7 = Specification::ImageFeatureType::default_instance();
      }
      if (pIVar7->_oneof_case_[0] == 0x1f) {
        pIVar13 = (pIVar7->SizeFlexibility_).imagesizerange_;
      }
      else {
        pIVar13 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
      }
      pSVar22 = pIVar13->heightrange_;
      if (pSVar22 == (SizeRange *)0x0) {
        pSVar22 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      ShapeRange::ShapeRange((ShapeRange *)&local_50,pSVar22);
    }
    else {
      if (uVar3 != 0x15) {
        return;
      }
      min = 0xffffffffffffffff;
      iVar21 = 0;
      uVar23 = 0;
      max = 0;
      uVar19 = 0xffffffffffffffff;
      local_90 = this;
      while( true ) {
        if (type->_oneof_case_[0] == 4) {
          pIVar7 = (type->Type_).imagetype_;
        }
        else {
          pIVar7 = Specification::ImageFeatureType::default_instance();
        }
        if (pIVar7->_oneof_case_[0] == 0x15) {
          pIVar8 = (pIVar7->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar8 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        if ((pIVar8->sizes_).super_RepeatedPtrFieldBase.current_size_ <= iVar21) break;
        if (type->_oneof_case_[0] == 4) {
          pIVar7 = (type->Type_).imagetype_;
        }
        else {
          pIVar7 = Specification::ImageFeatureType::default_instance();
        }
        if (pIVar7->_oneof_case_[0] == 0x15) {
          pIVar8 = (pIVar7->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar8 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                           (&(pIVar8->sizes_).super_RepeatedPtrFieldBase,iVar21);
        uVar1 = pTVar6->width_;
        if (max < uVar1) {
          max = uVar1;
        }
        if (uVar1 < uVar19) {
          uVar19 = uVar1;
        }
        if (type->_oneof_case_[0] == 4) {
          pIVar7 = (type->Type_).imagetype_;
        }
        else {
          pIVar7 = Specification::ImageFeatureType::default_instance();
        }
        if (pIVar7->_oneof_case_[0] == 0x15) {
          pIVar8 = (pIVar7->SizeFlexibility_).enumeratedsizes_;
        }
        else {
          pIVar8 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                           (&(pIVar8->sizes_).super_RepeatedPtrFieldBase,iVar21);
        uVar1 = pTVar6->height_;
        if (uVar23 < uVar1) {
          uVar23 = uVar1;
        }
        if (uVar1 < min) {
          min = uVar1;
        }
        iVar21 = iVar21 + 1;
      }
      ShapeRange::ShapeRange((ShapeRange *)local_88,uVar19,max);
      this = local_90;
      updateWidthRange(local_90,(ShapeRange *)local_88);
      ShapeRange::ShapeRange((ShapeRange *)&local_50,min,uVar23);
    }
    updateHeightRange(this,(ShapeRange *)&local_50);
  }
  return;
}

Assistant:

void ShapeConstraint::updateConstraint(const Specification::FeatureType& type) {

    if (type.Type_case() == Specification::FeatureType::kImageType) {

        // Handle the number of channels first
        if (type.imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
            setChannel(1);
        else {
            setChannel(3);
        }

        switch (type.imagetype().SizeFlexibility_case()) {

            case CoreML::Specification::ImageFeatureType::kEnumeratedSizes: {

                size_t min_width = SIZE_MAX;
                size_t max_width = 0;
                size_t min_height = SIZE_MAX;
                size_t max_height = 0;
                for (int i = 0; i < type.imagetype().enumeratedsizes().sizes_size(); i++) {
                    size_t width = (size_t)type.imagetype().enumeratedsizes().sizes(i).width();
                    if (width > max_width)
                        max_width = width;
                    if (width < min_width)
                        min_width = width;

                    size_t height = (size_t)type.imagetype().enumeratedsizes().sizes(i).height();
                    if (height > max_height)
                        max_height = height;
                    if (height < min_height)
                        min_height = height;
                }

                // This is a hack, in that it loses the numerated nature of the constraint
                ShapeRange widthRange = ShapeRange(min_width, max_width);
                updateWidthRange(widthRange);

                ShapeRange heightRange = ShapeRange(min_height, max_height);
                updateHeightRange(heightRange);

                break;
            }
            case CoreML::Specification::ImageFeatureType::kImageSizeRange: {

                ShapeRange allowedWidths(type.imagetype().imagesizerange().widthrange());
                updateWidthRange(allowedWidths);

                ShapeRange allowedHeights(type.imagetype().imagesizerange().heightrange());
                updateHeightRange(allowedHeights);

                break;
            }
            case CoreML::Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET: {
                // the back compatible portion -- if the shape isn't set, then we'll use the old fields
                setHeight(static_cast<size_t>(type.imagetype().height()));
                setWidth(static_cast<size_t>(type.imagetype().width()));

                break;
            }

        } // switch

    } // is an image
    else if (type.Type_case() == Specification::FeatureType::kMultiArrayType) {

        std::vector<ShapeRange> ranges;

        switch (type.multiarraytype().ShapeFlexibility_case()) {

            case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes: {
                int maxDims = 0;
                for (const auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                    if (shape.shape_size() > maxDims) {
                        maxDims = shape.shape_size();
                    }
                }
                for (int d=0; d<maxDims; d++) {
                    size_t minSize = SIZE_MAX;
                    size_t maxSize = 0;
                    for (int i = 0; i < type.multiarraytype().enumeratedshapes().shapes_size(); i++) {
                        size_t size = static_cast<size_t>(type.multiarraytype().enumeratedshapes().shapes(i).shape(d));
                        if (minSize > size)
                            minSize = size;
                        if (maxSize < size)
                            maxSize = size;
                    }
                    ranges.push_back(ShapeRange(minSize,maxSize));
                }
                break;
            }
            case CoreML::Specification::ArrayFeatureType::kShapeRange: {
                for (int i = 0; i < type.multiarraytype().shaperange().sizeranges_size(); i++) {
                    ranges.push_back(ShapeRange(type.multiarraytype().shaperange().sizeranges(i)));
                }
                break;
            }
            case  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        if (ranges.size() == 1) {
            updateChannelRange(ranges[0]);
        }
        else if (ranges.size() == 3) {
            updateChannelRange(ranges[0]);
            updateHeightRange(ranges[1]);
            updateWidthRange(ranges[2]);
        }
        else if (ranges.size() == 0) {
            // legacy case for older models.
            setChannel(static_cast<size_t>(type.multiarraytype().shape(0)));
            if (type.multiarraytype().shape_size() == 3) {
                setHeight(static_cast<size_t>(type.multiarraytype().shape(1)));
                setWidth(static_cast<size_t>(type.multiarraytype().shape(2)));
            }
            else {
                setHeight(1);
                setWidth(1);
            }
        }
        else {
            throw std::runtime_error("Attempting to constrain an input or output feature \"" + _name + "\" with an invalid array shape constraint.");
        }

    }
    else {
        throw std::runtime_error("Attempting to update feature constraint " + _name + " with a type description which is not a multi array or image.");
    }

}